

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shaderCompiler.cpp
# Opt level: O0

void compileThreadProc(void)

{
  bool bVar1;
  __int_type _Var2;
  size_type sVar3;
  reference pvVar4;
  ostream *poVar5;
  char *pcVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  float fVar11;
  char *local_6f8;
  string local_6b8 [36];
  float local_694;
  char *pcStack_690;
  float progress;
  char *resultCode;
  lock_guard<std::mutex> guard_3;
  char local_678 [4];
  int result;
  char buf [1024];
  ostringstream local_270 [8];
  ostringstream ss;
  lock_guard<std::mutex> local_f8;
  lock_guard<std::mutex> guard_2;
  FILE *pipe;
  string commandLine;
  lock_guard<std::mutex> guard_1;
  lock_guard<std::mutex> local_b0;
  lock_guard<std::mutex> guard;
  CompileTask task;
  
  do {
    if (((g_Terminate ^ 0xffU) & 1) == 0) {
      return;
    }
    CompileTask::CompileTask((CompileTask *)&guard);
    std::lock_guard<std::mutex>::lock_guard(&local_b0,&g_TaskMutex);
    bVar1 = std::vector<CompileTask,_std::allocator<CompileTask>_>::empty(&g_CompileTasks);
    if (!bVar1) {
      sVar3 = std::vector<CompileTask,_std::allocator<CompileTask>_>::size(&g_CompileTasks);
      pvVar4 = std::vector<CompileTask,_std::allocator<CompileTask>_>::operator[]
                         (&g_CompileTasks,sVar3 - 1);
      CompileTask::operator=((CompileTask *)&guard,pvVar4);
      std::vector<CompileTask,_std::allocator<CompileTask>_>::pop_back(&g_CompileTasks);
    }
    std::lock_guard<std::mutex>::~lock_guard(&local_b0);
    if (!bVar1) {
      if ((g_Options.verbose & 1U) != 0) {
        std::lock_guard<std::mutex>::lock_guard
                  ((lock_guard<std::mutex> *)((long)&commandLine.field_2 + 8),&g_ReportMutex);
        poVar5 = std::operator<<((ostream *)&std::cout,
                                 (string *)(task.combinedDefines.field_2._M_local_buf + 8));
        std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
        std::lock_guard<std::mutex>::~lock_guard
                  ((lock_guard<std::mutex> *)((long)&commandLine.field_2 + 8));
      }
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&pipe,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&task.combinedDefines.field_2 + 8)," 2>&1");
      pcVar6 = (char *)std::__cxx11::string::c_str();
      guard_2._M_device = (mutex_type *)popen(pcVar6,"r");
      if ((FILE *)guard_2._M_device == (FILE *)0x0) {
        std::lock_guard<std::mutex>::lock_guard(&local_f8,&g_ReportMutex);
        poVar5 = std::operator<<((ostream *)&std::cout,"ERROR: cannot run ");
        poVar5 = std::operator<<(poVar5,(string *)&g_Options.compilerPath);
        std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
        g_CompileSuccess = false;
        g_Terminate = true;
        bVar1 = true;
        std::lock_guard<std::mutex>::~lock_guard(&local_f8);
      }
      else {
        std::__cxx11::ostringstream::ostringstream(local_270);
        while (pcVar6 = fgets(local_678,0x400,(FILE *)guard_2._M_device), pcVar6 != (char *)0x0) {
          std::operator<<((ostream *)local_270,local_678);
        }
        guard_3._M_device._4_4_ = pclose((FILE *)guard_2._M_device);
        std::__atomic_base<int>::operator++(&g_ProcessedTaskCount.super___atomic_base<int>,0);
        std::lock_guard<std::mutex>::lock_guard
                  ((lock_guard<std::mutex> *)&resultCode,&g_ReportMutex);
        if (guard_3._M_device._4_4_ == 0) {
          local_6f8 = " OK  ";
        }
        else {
          local_6f8 = "FAIL ";
        }
        pcStack_690 = local_6f8;
        _Var2 = std::__atomic_base::operator_cast_to_int((__atomic_base *)&g_ProcessedTaskCount);
        local_694 = (float)_Var2 / (float)g_OriginalTaskCount;
        fVar11 = local_694 * 100.0;
        uVar7 = std::__cxx11::string::c_str();
        pcVar6 = pcStack_690;
        uVar8 = std::__cxx11::string::c_str();
        uVar9 = std::__cxx11::string::c_str();
        uVar10 = std::__cxx11::string::c_str();
        sprintf(local_678,"[%5.1f%%] %s %s %s:%s %s",(double)fVar11,uVar7,pcVar6,uVar8,uVar9,uVar10)
        ;
        poVar5 = std::operator<<((ostream *)&std::cout,local_678);
        std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
        if ((guard_3._M_device._4_4_ != 0) && ((g_Terminate & 1U) == 0)) {
          poVar5 = std::operator<<((ostream *)&std::cout,"ERRORS for ");
          poVar5 = std::operator<<(poVar5,(string *)(task.sourceFile.field_2._M_local_buf + 8));
          poVar5 = std::operator<<(poVar5,":");
          poVar5 = std::operator<<(poVar5,(string *)(task.shaderName.field_2._M_local_buf + 8));
          poVar5 = std::operator<<(poVar5," ");
          poVar5 = std::operator<<(poVar5,(string *)(task.entryPoint.field_2._M_local_buf + 8));
          poVar5 = std::operator<<(poVar5,": ");
          std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
          std::__cxx11::ostringstream::str();
          poVar5 = std::operator<<((ostream *)&std::cout,local_6b8);
          std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
          std::__cxx11::string::~string(local_6b8);
          g_CompileSuccess = false;
        }
        std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)&resultCode);
        std::__cxx11::ostringstream::~ostringstream(local_270);
        bVar1 = false;
      }
      std::__cxx11::string::~string((string *)&pipe);
    }
    CompileTask::~CompileTask((CompileTask *)&guard);
  } while (bVar1 == false);
  return;
}

Assistant:

void compileThreadProc()
{
	while (!g_Terminate)
	{
		CompileTask task;
		{
			lock_guard<mutex> guard(g_TaskMutex);
			if (g_CompileTasks.empty())
				return;

			task = g_CompileTasks[g_CompileTasks.size() - 1];
			g_CompileTasks.pop_back();
		}

		if (g_Options.verbose)
		{
			lock_guard<mutex> guard(g_ReportMutex);
			cout << task.commandLine << endl;
		}

		string commandLine = task.commandLine + " 2>&1";

		FILE* pipe = popen(commandLine.c_str(), "r");
		if (!pipe)
		{
			lock_guard<mutex> guard(g_ReportMutex);
			cout << "ERROR: cannot run " << g_Options.compilerPath << endl;
			g_CompileSuccess = false;
			g_Terminate = true;
			return;
		}

		ostringstream ss;
		char buf[1024];
		while (fgets(buf, sizeof(buf), pipe))
			ss << buf;

		int result = pclose(pipe);
		g_ProcessedTaskCount++;

		{
			lock_guard<mutex> guard(g_ReportMutex);

			const char* resultCode = (result == 0) ? " OK  " : "FAIL ";
			float progress = (float)g_ProcessedTaskCount / (float)g_OriginalTaskCount;

			sprintf(buf, "[%5.1f%%] %s %s %s:%s %s", 
				progress * 100.f, 
				g_PlatformName.c_str(), 
				resultCode, 
				task.shaderName.c_str(), 
				task.entryPoint.c_str(), 
				task.combinedDefines.c_str());

			cout << buf << endl;
 
			if (result != 0 && !g_Terminate)
			{
				cout << "ERRORS for " << task.shaderName << ":" << task.entryPoint << " " << task.combinedDefines << ": " << endl;
				cout << ss.str() << endl;
				g_CompileSuccess = false;
			}
		}
	}
}